

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O2

void __thiscall
deqp::sl::ShaderCase::specializeShaders
          (ShaderCase *this,char *vertexSource,char *fragmentSource,string *outVertexSource,
          string *outFragmentSource,ValueBlock *valueBlock)

{
  int iVar1;
  pointer pVVar2;
  DataType DVar3;
  ostream *poVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ostringstream *poVar8;
  byte bVar9;
  int ndx_1;
  string *psVar10;
  int ndx;
  long lVar11;
  char *pcVar12;
  string *checkVarName;
  long lVar13;
  bool bVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  allocator<char> local_3c1;
  char *fragColor;
  StringTemplate tmpl;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream decl;
  ostringstream setup;
  
  bVar14 = GLSL_VERSION_150 < this->m_targetVersion;
  bVar9 = 0xe >> ((byte)this->m_targetVersion & 0x1f);
  checkVarName = outFragmentSource;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
  pcVar12 = "attribute";
  if (bVar14 || (bVar9 & 1) != 0) {
    pcVar12 = "in";
  }
  poVar4 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
  std::operator<<(poVar4," highp vec4 dEQP_Position;\n");
  lVar13 = 0x28;
  lVar11 = 0;
  while( true ) {
    pVVar2 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x48) <= lVar11)
    break;
    pcVar5 = glu::getDataTypeName(*(DataType *)((long)&pVVar2->storageType + lVar13));
    psVar10 = (string *)((long)pVVar2 + lVar13 + -0x20);
    iVar1 = *(int *)((long)pVVar2 + lVar13 + -0x28);
    if (iVar1 == 0) {
      lVar6 = std::__cxx11::string::find((char)psVar10,0x2e);
      if (lVar6 == -1) {
        poVar4 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,"uniform "
                                );
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4," ");
LAB_00d64500:
        poVar4 = std::operator<<(poVar4,psVar10);
        std::operator<<(poVar4,";\n");
      }
    }
    else if (iVar1 == 1) {
      DVar3 = glu::getDataTypeScalarType(*(DataType *)((long)&pVVar2->storageType + lVar13));
      if (DVar3 == TYPE_FLOAT) {
        poVar4 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4," ");
        psVar10 = (string *)&pVVar2[lVar11].valueName;
        goto LAB_00d64500;
      }
      DVar3 = glu::getDataTypeFloatScalars(*(DataType *)((long)&pVVar2->storageType + lVar13));
      pcVar7 = glu::getDataTypeName(DVar3);
      poVar4 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,pcVar12);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar7);
      poVar4 = std::operator<<(poVar4," a_");
      poVar4 = std::operator<<(poVar4,psVar10);
      std::operator<<(poVar4,";\n");
      poVar4 = std::operator<<(&setup.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,psVar10);
      poVar4 = std::operator<<(poVar4," = ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4,"(a_");
      poVar4 = std::operator<<(poVar4,psVar10);
      std::operator<<(poVar4,");\n");
    }
    lVar11 = lVar11 + 1;
    lVar13 = lVar13 + 0x48;
  }
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl,(char (*) [20])"VERTEX_DECLARATIONS",&local_3e8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&params,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&tmpl);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::stringbuf::str();
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl,(char (*) [13])"VERTEX_SETUP",&local_3e8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&params,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&tmpl);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,"gl_Position = dEQP_Position;\n",(allocator<char> *)&fragColor);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl,(char (*) [14])"VERTEX_OUTPUT",&local_3e8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&params,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tmpl);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&tmpl);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3e8,vertexSource,(allocator<char> *)&fragColor);
  tcu::StringTemplate::StringTemplate(&tmpl,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::StringTemplate::specialize(&local_3e8,&tmpl,&params);
  std::__cxx11::string::operator=((string *)outVertexSource,(string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  tcu::StringTemplate::~StringTemplate(&tmpl);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&decl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&setup);
  pcVar12 = "gl_FragColor";
  if (bVar14 || (bVar9 & 1) != 0) {
    pcVar12 = "dEQP_FragColor";
  }
  fragColor = pcVar12;
  genCompareFunctions(&decl,valueBlock,false);
  genCompareOp(&setup,pcVar12,valueBlock,glcts::fixed_sample_locations_values + 1,
               (char *)checkVarName);
  if (bVar14 || (bVar9 & 1) != 0) {
    std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,
                    "layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  }
  lVar11 = 0;
  lVar13 = 0;
  do {
    pVVar2 = (valueBlock->values).
             super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(valueBlock->values).
                     super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar2) / 0x48) <= lVar13) {
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &params._M_t._M_impl.super__Rb_tree_header._M_header;
      params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [22])"FRAGMENT_DECLARATIONS",&local_3e8);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::stringbuf::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [16])"FRAGMENT_OUTPUT",&local_3e8);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_const_char_*&,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl,(char (*) [11])0x17ce887,&fragColor);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&params,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&tmpl);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&tmpl);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,fragmentSource,&local_3c1);
      tcu::StringTemplate::StringTemplate(&tmpl,&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      tcu::StringTemplate::specialize(&local_3e8,&tmpl,&params);
      std::__cxx11::string::operator=((string *)outFragmentSource,(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      tcu::StringTemplate::~StringTemplate(&tmpl);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&params._M_t);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&setup);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&decl);
      return;
    }
    pcVar12 = *(char **)((long)&(pVVar2->valueName)._M_dataplus._M_p + lVar11);
    pcVar5 = glu::getDataTypeName(*(DataType *)((long)&pVVar2->dataType + lVar11));
    iVar1 = *(int *)((long)&pVVar2->storageType + lVar11);
    if (iVar1 == 0) {
      lVar6 = std::__cxx11::string::find((char)lVar11 + (char)pVVar2 + '\b',0x2e);
      if (lVar6 == -1) {
        poVar8 = (ostringstream *)
                 std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,"uniform "
                                );
        goto LAB_00d648ec;
      }
    }
    else if (iVar1 == 2) {
      poVar4 = std::operator<<(&decl.super_basic_ostream<char,_std::char_traits<char>_>,"uniform ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      poVar4 = std::operator<<(poVar4," ref_");
      poVar4 = std::operator<<(poVar4,pcVar12);
      std::operator<<(poVar4,";\n");
      poVar8 = &decl;
LAB_00d648ec:
      poVar4 = std::operator<<(&poVar8->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,pcVar12);
      std::operator<<(poVar4,";\n");
    }
    lVar13 = lVar13 + 1;
    lVar11 = lVar11 + 0x48;
  } while( true );
}

Assistant:

void ShaderCase::specializeShaders(const char* vertexSource, const char* fragmentSource, string& outVertexSource,
								   string& outFragmentSource, const ValueBlock& valueBlock)
{
	const bool usesInout	  = usesShaderInoutQualifiers(m_targetVersion);
	const bool customColorOut = usesInout;

	// Vertex shader specialization.
	{
		ostringstream decl;
		ostringstream setup;
		const char*   vtxIn = usesInout ? "in" : "attribute";

		decl << vtxIn << " highp vec4 dEQP_Position;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val	 = valueBlock.values[ndx];
			const char*				 typeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
			{
				if (getDataTypeScalarType(val.dataType) == TYPE_FLOAT)
				{
					decl << vtxIn << " " << typeStr << " " << val.valueName << ";\n";
				}
				else
				{
					DataType	floatType	= getDataTypeFloatScalars(val.dataType);
					const char* floatTypeStr = getDataTypeName(floatType);

					decl << vtxIn << " " << floatTypeStr << " a_" << val.valueName << ";\n";
					setup << typeStr << " " << val.valueName << " = " << typeStr << "(a_" << val.valueName << ");\n";
				}
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << typeStr << " " << val.valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("VERTEX_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("VERTEX_SETUP", setup.str()));
		params.insert(pair<string, string>("VERTEX_OUTPUT", string("gl_Position = dEQP_Position;\n")));
		StringTemplate tmpl(vertexSource);
		outVertexSource = tmpl.specialize(params);
	}

	// Fragment shader specialization.
	{
		ostringstream decl;
		ostringstream output;
		const char*   fragColor = customColorOut ? "dEQP_FragColor" : "gl_FragColor";

		genCompareFunctions(decl, valueBlock, false);
		genCompareOp(output, fragColor, valueBlock, "", DE_NULL);

		if (customColorOut)
			decl << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";

		for (int ndx = 0; ndx < (int)valueBlock.values.size(); ndx++)
		{
			const ShaderCase::Value& val		= valueBlock.values[ndx];
			const char*				 valueName  = val.valueName.c_str();
			const char*				 refTypeStr = getDataTypeName(val.dataType);

			if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			{
				decl << "uniform " << refTypeStr << " ref_" << valueName << ";\n";
				decl << refTypeStr << " " << valueName << ";\n";
			}
			else if (val.storageType == ShaderCase::Value::STORAGE_UNIFORM && val.valueName.find('.') == string::npos)
			{
				decl << "uniform " << refTypeStr << " " << valueName << ";\n";
			}
		}

		map<string, string> params;
		params.insert(pair<string, string>("FRAGMENT_DECLARATIONS", decl.str()));
		params.insert(pair<string, string>("FRAGMENT_OUTPUT", output.str()));
		params.insert(pair<string, string>("FRAG_COLOR", fragColor));
		StringTemplate tmpl(fragmentSource);
		outFragmentSource = tmpl.specialize(params);
	}
}